

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O1

void helics::apps::TypedBrokerServer::assignPort
               (portData *pd,int pnumber,shared_ptr<helics::Broker> *brk)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)pd;
  while( true ) {
    if (puVar1 == *(undefined8 **)(pd + 8)) {
      return;
    }
    if (*(int *)((long)puVar1 + 0x14) == pnumber) break;
    puVar1 = puVar1 + 3;
  }
  *(undefined1 *)(puVar1 + 2) = 1;
  *puVar1 = (brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return;
}

Assistant:

void TypedBrokerServer::assignPort(portData& pd, int pnumber, std::shared_ptr<Broker>& brk)
{
    for (auto& pdi : pd) {
        if (std::get<0>(pdi) == pnumber) {
            std::get<1>(pdi) = true;
            std::get<2>(pdi) = brk;
            break;
        }
    }
}